

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationStart
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  pointer ppTVar1;
  TestEventListener *pTVar2;
  size_t i;
  ulong uVar3;
  
  if (this->forwarding_enabled_ == true) {
    for (uVar3 = 0;
        ppTVar1 = (this->listeners_).
                  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->listeners_).
                              super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
        uVar3 = uVar3 + 1) {
      pTVar2 = ppTVar1[uVar3];
      (*pTVar2->_vptr_TestEventListener[3])(pTVar2,unit_test,(ulong)(uint)iteration);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationStart(const UnitTest& unit_test,
                                             int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = 0; i < listeners_.size(); i++) {
      listeners_[i]->OnTestIterationStart(unit_test, iteration);
    }
  }
}